

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

bb_insn_t_conflict get_def(gen_ctx_t gen_ctx,MIR_reg_t reg,bb_t_conflict bb)

{
  MIR_context_t ctx_00;
  def_tab_el_t el_00;
  def_tab_el_t el_01;
  MIR_op_t op_00;
  int iVar1;
  size_t sVar2;
  in_edge_t_conflict peVar3;
  MIR_op_t local_d8;
  undefined8 uStack_a8;
  MIR_op_t op;
  undefined1 local_70 [8];
  def_tab_el_t tab_el;
  def_tab_el_t el;
  bb_insn_t_conflict def;
  bb_t_conflict src;
  MIR_context_t ctx;
  bb_t_conflict bb_local;
  MIR_reg_t reg_local;
  gen_ctx_t gen_ctx_local;
  
  ctx_00 = gen_ctx->ctx;
  el_00._12_4_ = el.bb._4_4_;
  el_00.reg = reg;
  el_00.bb = bb;
  el_00.def = (bb_insn_t_conflict)el._8_8_;
  tab_el.def = (bb_insn_t_conflict)bb;
  iVar1 = HTAB_def_tab_el_t_do(gen_ctx->ssa_ctx->def_tab,el_00,HTAB_FIND,(def_tab_el_t *)local_70);
  if (iVar1 == 0) {
    sVar2 = DLIST_in_edge_t_length(&bb->in_edges);
    if (sVar2 == 1) {
      peVar3 = DLIST_in_edge_t_head(&bb->in_edges);
      if (peVar3->src->index == 0) {
        gen_ctx_local = (gen_ctx_t)get_fake_insn(gen_ctx,gen_ctx->ssa_ctx->arg_bb_insns,reg);
      }
      else {
        peVar3 = DLIST_in_edge_t_head(&bb->in_edges);
        gen_ctx_local = (gen_ctx_t)get_def(gen_ctx,reg,peVar3->src);
      }
    }
    else {
      _MIR_new_var_op(&local_d8,ctx_00,reg);
      memcpy(&uStack_a8,&local_d8,0x30);
      op_00._8_8_ = op.data;
      op_00.data = (void *)uStack_a8;
      op_00.u.i = op._8_8_;
      op_00.u._8_8_ = op.u.i;
      op_00.u._16_8_ = op.u.str.s;
      op_00.u.mem.disp = op.u._16_8_;
      gen_ctx_local = (gen_ctx_t)create_phi(gen_ctx,bb,op_00);
      el_01._12_4_ = el.bb._4_4_;
      el_01.reg = reg;
      el_01.bb = (bb_t_conflict)tab_el.def;
      el_01.def = (bb_insn_t_conflict)gen_ctx_local;
      HTAB_def_tab_el_t_do(gen_ctx->ssa_ctx->def_tab,el_01,HTAB_INSERT,(def_tab_el_t *)local_70);
    }
  }
  else {
    gen_ctx_local = (gen_ctx_t)tab_el._8_8_;
  }
  return (bb_insn_t_conflict)gen_ctx_local;
}

Assistant:

static bb_insn_t get_def (gen_ctx_t gen_ctx, MIR_reg_t reg, bb_t bb) {
  MIR_context_t ctx = gen_ctx->ctx;
  bb_t src;
  bb_insn_t def;
  def_tab_el_t el, tab_el;
  MIR_op_t op;

  el.bb = bb;
  el.reg = reg;
  if (HTAB_DO (def_tab_el_t, def_tab, el, HTAB_FIND, tab_el)) return tab_el.def;
  if (DLIST_LENGTH (in_edge_t, bb->in_edges) == 1) {
    if ((src = DLIST_HEAD (in_edge_t, bb->in_edges)->src)->index == 0) { /* start bb: args */
      return get_fake_insn (gen_ctx, arg_bb_insns, reg);
    }
    return get_def (gen_ctx, reg, DLIST_HEAD (in_edge_t, bb->in_edges)->src);
  }
  op = _MIR_new_var_op (ctx, reg);
  el.def = def = create_phi (gen_ctx, bb, op);
  HTAB_DO (def_tab_el_t, def_tab, el, HTAB_INSERT, tab_el);
  return el.def;
}